

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Aig_Man_t *
createNewAigWith0LivePoWithDSC
          (Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live,int windowBeginIndex,
          int withinWindowIndex,int pendingSignalIndex,Vec_Ptr_t *vBarriers)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__s;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *vBarrierLo;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *__ptr;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Ptr_t *vMonotoneDisjunctionNodes;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  Vec_Ptr_t *__ptr_00;
  Aig_Obj_t *pAVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  Aig_Obj_t *pAVar17;
  Aig_Man_t *pAVar18;
  ulong uVar19;
  int iVar20;
  int local_90;
  
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar4 = strlen(pAig->pName);
  __s = (char *)malloc(sVar4 + 7);
  p->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"0Live");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar15 = 0;
    do {
      if (pAig->vCis->nSize <= lVar15) goto LAB_005ba06e;
      pvVar1 = pAig->vCis->pArray[lVar15];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pAig->nTruePis);
  }
  if (pAig->nRegs < 1) {
    local_90 = 2;
  }
  else {
    iVar16 = 0;
    do {
      local_90 = iVar16;
      uVar2 = pAig->nTruePis + local_90;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) goto LAB_005ba06e;
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      iVar16 = local_90 + 1;
    } while (local_90 + 1 < pAig->nRegs);
    local_90 = local_90 + 3;
  }
  vBarrierLo = createArenaLO(p,vBarriers);
  iVar16 = vBarrierLo->nSize;
  pAVar5 = Aig_ObjCreateCi(p);
  pAVar6 = Aig_ObjCreateCi(p);
  pAVar18 = p;
  __ptr = createMonotoneBarrierLO(p,vBarriers);
  uVar2 = __ptr->nSize;
  pVVar8 = pAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar15];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005ba08d;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar17 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar17 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar13 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar13 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar18 = p;
        pAVar17 = Aig_And(p,pAVar17,pAVar13);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar17;
        pVVar8 = pAig->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar8->nSize);
  }
  if ((((-1 < windowBeginIndex) && (windowBeginIndex < pAig->vCos->nSize)) &&
      (pAVar17 = driverToPoNew(pAVar18,(Aig_Obj_t *)pAig->vCos->pArray[(uint)windowBeginIndex]),
      -1 < withinWindowIndex)) && (withinWindowIndex < pAig->vCos->nSize)) {
    pAVar13 = driverToPoNew(pAVar18,(Aig_Obj_t *)pAig->vCos->pArray[(uint)withinWindowIndex]);
    iVar20 = vBarriers->nSize;
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar14 = 8;
    if (6 < iVar20 - 1U) {
      iVar14 = iVar20;
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar14;
    if (iVar14 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar14 * 8);
    }
    pVVar8->pArray = ppvVar9;
    vMonotoneDisjunctionNodes = (Vec_Ptr_t *)malloc(0x10);
    vMonotoneDisjunctionNodes->nSize = 0;
    vMonotoneDisjunctionNodes->nCap = iVar14;
    if (iVar14 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar14 << 3);
    }
    vMonotoneDisjunctionNodes->pArray = ppvVar9;
    pAVar17 = createArenaViolation
                        (pAig,p,pAVar17,pAVar13,vBarriers,vBarrierLo,pVVar8,
                         vMonotoneDisjunctionNodes);
    if (vMonotoneDisjunctionNodes->nSize != vBarriers->nSize) {
      __assert_fail("Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                    ,0x1aa,
                    "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                   );
    }
    pAVar18 = p;
    pAVar17 = Aig_Or(p,pAVar17,pAVar5);
    if ((-1 < pendingSignalIndex) && (pendingSignalIndex < pAig->vCos->nSize)) {
      pAVar13 = driverToPoNew(pAVar18,(Aig_Obj_t *)pAig->vCos->pArray[(uint)pendingSignalIndex]);
      pAVar10 = Aig_And(p,pAVar13,pAVar6);
      pAVar6 = p->pConst1;
      if (0 < vMonotoneDisjunctionNodes->nSize) {
        uVar7 = 0;
        uVar19 = 0;
        if (0 < (int)uVar2) {
          uVar19 = (ulong)uVar2;
        }
        do {
          if (uVar19 == uVar7) goto LAB_005ba06e;
          pAVar12 = (Aig_Obj_t *)vMonotoneDisjunctionNodes->pArray[uVar7];
          pAVar11 = Aig_And(p,pAVar10,(Aig_Obj_t *)__ptr->pArray[uVar7]);
          pAVar12 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar11 ^ 1),pAVar12);
          pAVar6 = Aig_And(p,pAVar6,pAVar12);
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)vMonotoneDisjunctionNodes->nSize);
      }
      iVar20 = 0;
      lVar15 = 0;
      if (0 < pAig->nTruePos) {
        lVar15 = 0;
        do {
          if (pAig->vCos->nSize <= lVar15) goto LAB_005ba06e;
          pvVar1 = pAig->vCos->pArray[lVar15];
          if (((ulong)pvVar1 & 1) != 0) goto LAB_005ba08d;
          uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          pAVar10 = Aig_ObjCreateCo(p,pAVar10);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar10;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pAig->nTruePos);
      }
      pAVar10 = createConstrained0LiveConeWithDSC(p,signalList);
      pAVar5 = Aig_Or(p,pAVar10,pAVar5);
      pAVar5 = Aig_And(p,pAVar5,pAVar6);
      Aig_ObjCreateCo(p,pAVar5);
      *index0Live = (int)lVar15;
      if (0 < pAig->nRegs) {
        iVar20 = 0;
        do {
          uVar3 = pAig->nTruePos + iVar20;
          if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_005ba06e;
          pvVar1 = pAig->vCos->pArray[uVar3];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005ba08d:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          iVar20 = iVar20 + 1;
          pAVar5 = Aig_ObjCreateCo(p,pAVar5);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
        } while (iVar20 < pAig->nRegs);
      }
      if (pVVar8->nSize != vBarriers->nSize) {
        __assert_fail("Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x1e5,
                      "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                     );
      }
      __ptr_00 = createArenaLi(p,vBarriers,pVVar8);
      iVar14 = __ptr_00->nSize;
      Aig_ObjCreateCo(p,pAVar17);
      Aig_ObjCreateCo(p,pAVar13);
      iVar14 = iVar14 + 2;
      if (0 < vMonotoneDisjunctionNodes->nSize) {
        lVar15 = 0;
        do {
          Aig_ObjCreateCo(p,(Aig_Obj_t *)vMonotoneDisjunctionNodes->pArray[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < vMonotoneDisjunctionNodes->nSize);
        iVar14 = iVar14 + (int)lVar15;
      }
      iVar16 = local_90 + iVar16 + uVar2;
      if (iVar16 != iVar14 + iVar20) {
        __assert_fail("loCopied + loCreated == liCopied + liCreated",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x201,
                      "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                     );
      }
      Aig_ManSetRegNum(p,iVar16);
      Aig_ManCleanup(p);
      iVar16 = Aig_ManCheck(p);
      if (iVar16 == 0) {
        __assert_fail("Aig_ManCheck( pNewAig )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x206,
                      "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                     );
      }
      if (vBarrierLo->pArray != (void **)0x0) {
        free(vBarrierLo->pArray);
      }
      free(vBarrierLo);
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
      }
      free(__ptr);
      if (pVVar8->pArray != (void **)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      if (__ptr_00->pArray != (void **)0x0) {
        free(__ptr_00->pArray);
      }
      free(__ptr_00);
      if (vMonotoneDisjunctionNodes->pArray != (void **)0x0) {
        free(vMonotoneDisjunctionNodes->pArray);
      }
      free(vMonotoneDisjunctionNodes);
      return p;
    }
  }
LAB_005ba06e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t *createNewAigWith0LivePoWithDSC( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live, int windowBeginIndex, int withinWindowIndex, int pendingSignalIndex, Vec_Ptr_t *vBarriers )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;
	int loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0;
	Aig_Obj_t *pObjWindowBeginsNew, *pObjWithinWindowNew, *pObjArenaViolation, *pObjTarget, *pObjArenaViolationLiDriver;
	Aig_Obj_t *pObjNewPoDriverArenaViolated, *pObjArenaViolationLo;
	Vec_Ptr_t *vBarrierLo, *vBarrierLiDriver, *vBarrierLi;
	Vec_Ptr_t *vMonotoneNodes;

#ifdef BARRIER_MONOTONE_TEST
	Aig_Obj_t *pObjPendingSignal;
	Aig_Obj_t *pObjPendingFlopLo;
	Vec_Ptr_t *vMonotoneBarrierLo;
	Aig_Obj_t *pObjPendingAndPendingSignal, *pObjMonotoneAnd, *pObjCurrMonotoneLo;
#endif

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 4: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//****************************************************************
	// Step 4.a: create register outputs for the barrier flops
	//****************************************************************
	vBarrierLo = createArenaLO( pNewAig, vBarriers );
	loCreated = Vec_PtrSize(vBarrierLo);

	//****************************************************************
	// Step 4.b: create register output for arenaViolationFlop
	//****************************************************************
	pObjArenaViolationLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 4.c: create register output for pendingFlop
	//****************************************************************
	pObjPendingFlopLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

	//****************************************************************
	// Step 4.d: create register outputs for the barrier flops
	// for asserting monotonicity
	//****************************************************************
	vMonotoneBarrierLo = createMonotoneBarrierLO( pNewAig, vBarriers );
	loCreated = loCreated + Vec_PtrSize(vMonotoneBarrierLo);
#endif

	//********************************************************************
	// Step 5: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	//********************************************************************
	// Step 5.a: create internal nodes corresponding to arenaViolation
	//********************************************************************
	pObjTarget = Aig_ManCo( pAig, windowBeginIndex );
	pObjWindowBeginsNew = driverToPoNew( pAig, pObjTarget );

	pObjTarget = Aig_ManCo( pAig, withinWindowIndex );
	pObjWithinWindowNew = driverToPoNew( pAig, pObjTarget );

	vBarrierLiDriver = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );
	vMonotoneNodes = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );

	pObjArenaViolation = createArenaViolation( pAig, pNewAig, 
				pObjWindowBeginsNew, pObjWithinWindowNew, 
				vBarriers, vBarrierLo, vBarrierLiDriver, vMonotoneNodes ); 
	assert( Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers) );

#ifdef ARENA_VIOLATION_CONSTRAINT

#endif

	pObjArenaViolationLiDriver = Aig_Or( pNewAig, pObjArenaViolation, pObjArenaViolationLo );

#ifdef BARRIER_MONOTONE_TEST
	//********************************************************************
	// Step 5.b: Create internal nodes for monotone testing
	//********************************************************************

	pObjTarget = Aig_ManCo( pAig, pendingSignalIndex );
	pObjPendingSignal = driverToPoNew( pAig, pObjTarget );
	
	pObjPendingAndPendingSignal = Aig_And( pNewAig, pObjPendingSignal, pObjPendingFlopLo );
	pObjMonotoneAnd = Aig_ManConst1( pNewAig );
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		pObjCurrMonotoneLo = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneBarrierLo, i);
		pObjMonotoneAnd = Aig_And( pNewAig, pObjMonotoneAnd,
			Aig_Or( pNewAig, 
			Aig_Not(Aig_And(pNewAig, pObjPendingAndPendingSignal, pObjCurrMonotoneLo)),
			pObj ) );
	}
#endif

	//********************************************************************
	// Step 6: create primary outputs
	//********************************************************************

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveConeWithDSC( pNewAig, signalList );
	pObjNewPoDriverArenaViolated = Aig_Or( pNewAig, pObjNewPoDriver, pObjArenaViolationLo );
#ifdef BARRIER_MONOTONE_TEST
	pObjNewPoDriverArenaViolated = Aig_And( pNewAig, pObjNewPoDriverArenaViolated, pObjMonotoneAnd );
#endif
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriverArenaViolated );

	*index0Live = i;

	//********************************************************************
	// Step 7: create register inputs
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//********************************************************************
	// Step 7.a: create register inputs for barrier flops
	//********************************************************************
	assert( Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers) );
	vBarrierLi = createArenaLi( pNewAig, vBarriers, vBarrierLiDriver );
	liCreated = Vec_PtrSize( vBarrierLi );

	//********************************************************************
	// Step 7.b: create register inputs for arenaViolation flop
	//********************************************************************
	Aig_ObjCreateCo( pNewAig, pObjArenaViolationLiDriver );
	liCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 7.c: create register input for pendingFlop
	//****************************************************************
	Aig_ObjCreateCo( pNewAig, pObjPendingSignal);
	liCreated++;

	//********************************************************************
	// Step 7.d: create register inputs for the barrier flops
	// for asserting monotonicity
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		Aig_ObjCreateCo( pNewAig, pObj );
		liCreated++;
	}
#endif

	assert(loCopied + loCreated == liCopied + liCreated);
	//next step should be changed
	Aig_ManSetRegNum( pNewAig, loCopied + loCreated );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );

	Vec_PtrFree(vBarrierLo);
	Vec_PtrFree(vMonotoneBarrierLo);
	Vec_PtrFree(vBarrierLiDriver);
	Vec_PtrFree(vBarrierLi);
	Vec_PtrFree(vMonotoneNodes);

	return pNewAig;
}